

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mock_loader_impl.c
# Opt level: O3

function_return
function_mock_interface_invoke(function func,function_impl impl,void **args,size_t size)

{
  undefined4 uVar1;
  double *value_ptr;
  undefined8 uVar2;
  undefined8 uVar3;
  long lVar4;
  function_return pvVar5;
  undefined8 uVar6;
  char *pcVar7;
  size_t args_count;
  size_t sVar8;
  double dVar9;
  double *pdVar10;
  undefined4 uVar11;
  
  uVar2 = function_signature();
  uVar3 = function_name(func);
  lVar4 = signature_get_return(uVar2);
  log_write_impl_va("metacall",0x4a,"function_mock_interface_invoke",
                    "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/loaders/mock_loader/source/mock_loader_impl.c"
                    ,0,"Invoking mock function %s",uVar3);
  if (size == 0) {
    log_write_impl_va("metacall",0x98,"function_mock_interface_invoke",
                      "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/loaders/mock_loader/source/mock_loader_impl.c"
                      ,0,"Calling mock function without arguments",uVar3);
  }
  else {
    sVar8 = 0;
    do {
      uVar3 = signature_get_type(uVar2,sVar8);
      uVar1 = type_index(uVar3);
      uVar11 = uVar1;
      log_write_impl_va("metacall",0x56,"function_mock_interface_invoke",
                        "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/loaders/mock_loader/source/mock_loader_impl.c"
                        ,0,"Type %p, %d",uVar3,uVar1);
      pdVar10 = (double *)args[sVar8];
      switch(uVar1) {
      case 0:
        pdVar10 = (double *)(ulong)*(byte *)pdVar10;
        uVar3 = 0x5c;
        uVar6 = 0;
        pcVar7 = "Boolean value: %d";
        break;
      case 1:
        pdVar10 = (double *)(ulong)(uint)(int)*(char *)pdVar10;
        uVar3 = 0x62;
        uVar6 = 0;
        pcVar7 = "Char value: %c";
        break;
      case 2:
        pdVar10 = (double *)(ulong)(uint)(int)*(short *)pdVar10;
        uVar3 = 0x68;
        uVar6 = 0;
        pcVar7 = "Short value: %d";
        break;
      case 3:
        pdVar10 = (double *)(ulong)(uint)*(float *)pdVar10;
        uVar3 = 0x6e;
        uVar6 = 0;
        pcVar7 = "Int value: %d";
        break;
      case 4:
        pdVar10 = (double *)*pdVar10;
        uVar3 = 0x74;
        uVar6 = 0;
        pcVar7 = "Long value: %ld";
        break;
      case 5:
        dVar9 = (double)*(float *)pdVar10;
        uVar6 = 0x7a;
        pcVar7 = "Float value: %f";
        goto LAB_001024d2;
      case 6:
        dVar9 = *pdVar10;
        uVar6 = 0x80;
        pcVar7 = "Double value: %f";
LAB_001024d2:
        log_write_impl_va(dVar9,"metacall",uVar6,"function_mock_interface_invoke",
                          "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/loaders/mock_loader/source/mock_loader_impl.c"
                          ,0,pcVar7,uVar3,uVar11);
        goto LAB_00102597;
      case 7:
        uVar3 = 0x86;
        uVar6 = 0;
        pcVar7 = "String value: %s";
        break;
      default:
        uVar3 = 0x90;
        uVar6 = 3;
        pcVar7 = "Unrecognized value: %p";
        break;
      case 0xb:
        uVar3 = 0x8c;
        uVar6 = 0;
        pcVar7 = "Pointer value: %p";
      }
      log_write_impl_va("metacall",uVar3,"function_mock_interface_invoke",
                        "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/loaders/mock_loader/source/mock_loader_impl.c"
                        ,uVar6,pcVar7,pdVar10,uVar11);
LAB_00102597:
      sVar8 = sVar8 + 1;
    } while (size != sVar8);
    log_write_impl_va("metacall",0x94,"function_mock_interface_invoke",
                      "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/loaders/mock_loader/source/mock_loader_impl.c"
                      ,0,"Calling mock function with arguments (%lu)",size,uVar11);
  }
  if (lVar4 != 0) {
    uVar1 = type_index(lVar4);
    uVar11 = uVar1;
    log_write_impl_va("metacall",0x9f,"function_mock_interface_invoke",
                      "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/loaders/mock_loader/source/mock_loader_impl.c"
                      ,0,"Return type %p, %d",lVar4,uVar1);
    switch(uVar1) {
    case 0:
      pvVar5 = (function_return)value_create_bool(1);
      return pvVar5;
    case 1:
      pvVar5 = (function_return)value_create_char(0x41);
      return pvVar5;
    case 2:
      pvVar5 = (function_return)value_create_short(0x7c);
      return pvVar5;
    case 3:
      pvVar5 = (function_return)value_create_int(0x4d2);
      return pvVar5;
    case 4:
      pvVar5 = (function_return)value_create_long(90000);
      return pvVar5;
    case 5:
      pvVar5 = (function_return)value_create_float(0x3e4ccccd);
      return pvVar5;
    case 6:
      pvVar5 = (function_return)value_create_double(0x400921ff2e48e8a7);
      return pvVar5;
    case 7:
      pvVar5 = (function_return)value_create_string("Hello World",0xb);
      return pvVar5;
    default:
      log_write_impl_va("metacall",0xcd,"function_mock_interface_invoke",
                        "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/loaders/mock_loader/source/mock_loader_impl.c"
                        ,3,"Unrecognized return type",lVar4,uVar11);
      break;
    case 0xb:
      pvVar5 = (function_return)value_create_ptr(&function_mock_interface_invoke::int_val);
      return pvVar5;
    }
  }
  return (function_return)0x0;
}

Assistant:

function_return function_mock_interface_invoke(function func, function_impl impl, function_args args, size_t size)
{
	loader_impl_mock_function mock_function = (loader_impl_mock_function)impl;

	signature s = function_signature(func);

	const char *name = function_name(func);

	type ret_type = signature_get_return(s);

	(void)mock_function;

	log_write("metacall", LOG_LEVEL_DEBUG, "Invoking mock function %s", name);

	if (size > 0)
	{
		size_t args_count;

		for (args_count = 0; args_count < size; ++args_count)
		{
			type t = signature_get_type(s, args_count);

			type_id id = type_index(t);

			log_write("metacall", LOG_LEVEL_DEBUG, "Type %p, %d", (void *)t, id);

			if (id == TYPE_BOOL)
			{
				boolean *value_ptr = (boolean *)(args[args_count]);

				log_write("metacall", LOG_LEVEL_DEBUG, "Boolean value: %d", *value_ptr);
			}
			else if (id == TYPE_CHAR)
			{
				char *value_ptr = (char *)(args[args_count]);

				log_write("metacall", LOG_LEVEL_DEBUG, "Char value: %c", *value_ptr);
			}
			else if (id == TYPE_SHORT)
			{
				short *value_ptr = (short *)(args[args_count]);

				log_write("metacall", LOG_LEVEL_DEBUG, "Short value: %d", *value_ptr);
			}
			else if (id == TYPE_INT)
			{
				int *value_ptr = (int *)(args[args_count]);

				log_write("metacall", LOG_LEVEL_DEBUG, "Int value: %d", *value_ptr);
			}
			else if (id == TYPE_LONG)
			{
				long *value_ptr = (long *)(args[args_count]);

				log_write("metacall", LOG_LEVEL_DEBUG, "Long value: %ld", *value_ptr);
			}
			else if (id == TYPE_FLOAT)
			{
				float *value_ptr = (float *)(args[args_count]);

				log_write("metacall", LOG_LEVEL_DEBUG, "Float value: %f", *value_ptr);
			}
			else if (id == TYPE_DOUBLE)
			{
				double *value_ptr = (double *)(args[args_count]);

				log_write("metacall", LOG_LEVEL_DEBUG, "Double value: %f", *value_ptr);
			}
			else if (id == TYPE_STRING)
			{
				const char *value_ptr = (const char *)(args[args_count]);

				log_write("metacall", LOG_LEVEL_DEBUG, "String value: %s", value_ptr);
			}
			else if (id == TYPE_PTR)
			{
				void *value_ptr = (void *)(args[args_count]);

				log_write("metacall", LOG_LEVEL_DEBUG, "Pointer value: %p", value_ptr);
			}
			else
			{
				log_write("metacall", LOG_LEVEL_ERROR, "Unrecognized value: %p", args[args_count]);
			}
		}

		log_write("metacall", LOG_LEVEL_DEBUG, "Calling mock function with arguments (%lu)", size);
	}
	else
	{
		log_write("metacall", LOG_LEVEL_DEBUG, "Calling mock function without arguments");
	}

	if (ret_type != NULL)
	{
		type_id id = type_index(ret_type);

		log_write("metacall", LOG_LEVEL_DEBUG, "Return type %p, %d", (void *)ret_type, id);

		if (id == TYPE_BOOL)
		{
			boolean b = 1;

			return value_create_bool(b);
		}
		else if (id == TYPE_CHAR)
		{
			return value_create_char('A');
		}
		else if (id == TYPE_SHORT)
		{
			return value_create_short(124);
		}
		else if (id == TYPE_INT)
		{
			return value_create_int(1234);
		}
		else if (id == TYPE_LONG)
		{
			return value_create_long(90000L);
		}
		else if (id == TYPE_FLOAT)
		{
			return value_create_float(0.2f);
		}
		else if (id == TYPE_DOUBLE)
		{
			return value_create_double(3.1416);
		}
		else if (id == TYPE_STRING)
		{
			static const char str[] = "Hello World";

			return value_create_string(str, sizeof(str) - 1);
		}
		else if (id == TYPE_PTR)
		{
			static int int_val = 15;

			return value_create_ptr(&int_val);
		}
		else
		{
			log_write("metacall", LOG_LEVEL_ERROR, "Unrecognized return type");
		}
	}

	return NULL;
}